

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::StyledWriter::writeArrayValue(StyledWriter *this,Value *value)

{
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  ArrayIndex AVar4;
  Value *root;
  ulong uVar5;
  long lVar6;
  string local_68;
  string *local_48;
  pointer local_40;
  pointer local_38;
  
  AVar4 = Value::size(value);
  if (AVar4 == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"[]","");
    pushValue(this,&local_68);
  }
  else {
    bVar3 = isMultineArray(this,value);
    if (!bVar3) {
      psVar1 = &this->document_;
      std::__cxx11::string::append((char *)psVar1);
      lVar6 = 0;
      do {
        if (lVar6 != 0) {
          std::__cxx11::string::append((char *)psVar1);
        }
        std::__cxx11::string::_M_append
                  ((char *)psVar1,
                   *(ulong *)((long)&(((this->childValues_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar6));
        lVar6 = lVar6 + 0x20;
      } while ((ulong)AVar4 << 5 != lVar6);
      std::__cxx11::string::append((char *)psVar1);
      return;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"[","");
    writeIndent(this);
    local_48 = &this->document_;
    std::__cxx11::string::_M_append((char *)local_48,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    indent(this);
    local_38 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = 8;
    uVar5 = 0;
    while( true ) {
      root = Value::operator[](value,(ArrayIndex)uVar5);
      writeCommentBeforeValue(this,root);
      if (local_38 == local_40) {
        writeIndent(this);
        writeValue(this,root);
      }
      else {
        pbVar2 = (this->childValues_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        writeIndent(this);
        std::__cxx11::string::_M_append((char *)local_48,*(ulong *)((long)pbVar2 + lVar6 + -8));
      }
      if (AVar4 - 1 == uVar5) break;
      uVar5 = uVar5 + 1;
      std::__cxx11::string::push_back((char)local_48);
      writeCommentAfterValueOnSameLine(this,root);
      lVar6 = lVar6 + 0x20;
    }
    writeCommentAfterValueOnSameLine(this,root);
    std::__cxx11::string::resize
              ((ulong)&this->indentString_,
               (char)(this->indentString_)._M_string_length - (char)this->indentSize_);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"]","");
    writeIndent(this);
    std::__cxx11::string::_M_append((char *)local_48,(ulong)local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StyledWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          writeIndent();
          writeValue(childValue);
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      document_ += "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          document_ += ", ";
        document_ += childValues_[index];
      }
      document_ += " ]";
    }
  }
}